

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

void __thiscall
nlohmann::detail::
parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::parser(parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
         *this,input_adapter_t *adapter,parser_callback_t *cb,bool allow_exceptions_)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  char cVar3;
  token_type tVar4;
  
  std::
  function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
  ::function(&this->callback,cb);
  this->last_token = uninitialized;
  (this->m_lexer).ia.
  super___shared_ptr<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (adapter->
           super___shared_ptr<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2>)
           ._M_ptr;
  p_Var2 = (adapter->
           super___shared_ptr<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2>)
           ._M_refcount._M_pi;
  (adapter->super___shared_ptr<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2>
  )._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_lexer).ia.
  super___shared_ptr<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar1;
  (this->m_lexer).ia.
  super___shared_ptr<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var2;
  (adapter->super___shared_ptr<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2>
  )._M_ptr = (element_type *)0x0;
  (this->m_lexer).current = -1;
  (this->m_lexer).next_unget = false;
  (this->m_lexer).position.chars_read_total = 0;
  (this->m_lexer).position.chars_read_current_line = 0;
  (this->m_lexer).position.lines_read = 0;
  (this->m_lexer).token_string.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_lexer).token_string.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_lexer).token_string.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_lexer).token_buffer._M_dataplus._M_p = (pointer)&(this->m_lexer).token_buffer.field_2;
  (this->m_lexer).token_buffer._M_string_length = 0;
  (this->m_lexer).token_buffer.field_2._M_local_buf[0] = '\0';
  (this->m_lexer).error_message = "";
  (this->m_lexer).value_integer = 0;
  (this->m_lexer).value_unsigned = 0;
  (this->m_lexer).value_float = 0.0;
  cVar3 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::get_decimal_point();
  (this->m_lexer).decimal_point_char = cVar3;
  this->allow_exceptions = allow_exceptions_;
  tVar4 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::scan(&this->m_lexer);
  this->last_token = tVar4;
  return;
}

Assistant:

explicit parser(detail::input_adapter_t&& adapter, const parser_callback_t cb = nullptr,
					const bool allow_exceptions_ = true)
		: callback(cb), m_lexer(std::move(adapter)), allow_exceptions(allow_exceptions_) {
		// read first token
		get_token();
	}